

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_3dPointArray *cv)

{
  bool bVar1;
  double *__src;
  long lVar2;
  long lVar3;
  long lVar4;
  
  bVar1 = Create(this,3,false,(cv->super_ON_SimpleArray<ON_3dPoint>).m_count);
  if ((bVar1) && (0 < this->m_order)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      __src = ON_3dPoint::operator_cast_to_double_
                        ((ON_3dPoint *)
                         ((long)&((cv->super_ON_SimpleArray<ON_3dPoint>).m_a)->x + lVar4));
      lVar2 = (long)this->m_order;
      if (lVar3 < lVar2 && this->m_cv != (double *)0x0) {
        memcpy(this->m_cv + (long)(int)lVar3 * (long)this->m_cv_stride,__src,
               (((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0)) * 8);
        lVar2 = (long)this->m_order;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < lVar2);
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_3dPointArray& cv)
{
  if ( Create( 3, false, cv.Count() ) )
  {
    int i;
    for ( i = 0; i < m_order; i++ )
      SetCV( i, ON::intrinsic_point_style, cv[i] );
  }
  return *this;
}